

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

UBool icu_63::compareRules(UVector *rules1,UVector *rules2)

{
  char cVar1;
  int32_t iVar2;
  int32_t iVar3;
  long *plVar4;
  void *pvVar5;
  TimeZoneRule *r2;
  TimeZoneRule *r1;
  int32_t i;
  int32_t size;
  UVector *rules2_local;
  UVector *rules1_local;
  
  if ((rules1 == (UVector *)0x0) && (rules2 == (UVector *)0x0)) {
    rules1_local._7_1_ = '\x01';
  }
  else if ((rules1 == (UVector *)0x0) || (rules2 == (UVector *)0x0)) {
    rules1_local._7_1_ = '\0';
  }
  else {
    iVar2 = UVector::size(rules1);
    iVar3 = UVector::size(rules2);
    if (iVar2 == iVar3) {
      for (r1._0_4_ = 0; (int)r1 < iVar2; r1._0_4_ = (int)r1 + 1) {
        plVar4 = (long *)UVector::elementAt(rules1,(int)r1);
        pvVar5 = UVector::elementAt(rules2,(int)r1);
        cVar1 = (**(code **)(*plVar4 + 0x28))(plVar4,pvVar5);
        if (cVar1 != '\0') {
          return '\0';
        }
      }
      rules1_local._7_1_ = '\x01';
    }
    else {
      rules1_local._7_1_ = '\0';
    }
  }
  return rules1_local._7_1_;
}

Assistant:

static UBool compareRules(UVector* rules1, UVector* rules2) {
    if (rules1 == NULL && rules2 == NULL) {
        return TRUE;
    } else if (rules1 == NULL || rules2 == NULL) {
        return FALSE;
    }
    int32_t size = rules1->size();
    if (size != rules2->size()) {
        return FALSE;
    }
    for (int32_t i = 0; i < size; i++) {
        TimeZoneRule *r1 = (TimeZoneRule*)rules1->elementAt(i);
        TimeZoneRule *r2 = (TimeZoneRule*)rules2->elementAt(i);
        if (*r1 != *r2) {
            return FALSE;
        }
    }
    return TRUE;
}